

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O3

void __thiscall CDBBatch::CDBBatch(CDBBatch *this,CDBWrapper *_parent)

{
  long lVar1;
  WriteBatchImpl *this_00;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->parent = _parent;
  this_00 = (WriteBatchImpl *)operator_new(0x20);
  (this_00->batch).rep_._M_dataplus = (pointer)0x0;
  (this_00->batch).rep_._M_string_length = 0;
  (this_00->batch).rep_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(this_00->batch).rep_.field_2 + 8) = 0;
  leveldb::WriteBatch::WriteBatch((WriteBatch *)this_00);
  (this->m_impl_batch)._M_t.
  super___uniq_ptr_impl<CDBBatch::WriteBatchImpl,_std::default_delete<CDBBatch::WriteBatchImpl>_>.
  _M_t.
  super__Tuple_impl<0UL,_CDBBatch::WriteBatchImpl_*,_std::default_delete<CDBBatch::WriteBatchImpl>_>
  .super__Head_base<0UL,_CDBBatch::WriteBatchImpl_*,_false>._M_head_impl = this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->ssValue).m_read_pos = 0;
    (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    (this->ssValue).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->ssKey).m_read_pos = 0;
    (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->ssKey).vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    this->size_estimate = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBBatch::CDBBatch(const CDBWrapper& _parent)
    : parent{_parent},
      m_impl_batch{std::make_unique<CDBBatch::WriteBatchImpl>()} {}